

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  rnndeccontext *prVar4;
  ulonglong uVar5;
  rnnenum *prVar6;
  rnnbitset *prVar7;
  rnndomain *addr;
  rnndecaddrinfo *prVar8;
  char **in_RSI;
  int in_EDI;
  rnndecaddrinfo *info;
  rnndomain *dom;
  rnnbitset *bs;
  int dec;
  int i;
  rnnenum *en;
  rnndb *db;
  rnndeccontext *vc;
  uint64_t val;
  uint64_t colors;
  uint64_t reg;
  char mode;
  char c;
  char *variant;
  char *name;
  char *file;
  rnndb *in_stack_ffffffffffffff70;
  char *pcVar9;
  rnndb *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  rnndeccontext *in_stack_ffffffffffffff88;
  rnndb *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffd4;
  undefined2 uVar10;
  uint uVar11;
  uint width;
  char *value;
  char *ti;
  char *pcVar12;
  int local_4;
  
  pcVar12 = "nv_mmio.xml";
  ti = "NV_MMIO";
  value = (char *)0x0;
  uVar11 = (uint)CONCAT12(100,in_stack_ffffffffffffffd4);
  bVar1 = true;
  rnn_init();
  if (in_EDI < 2) {
    usage();
  }
  rnn_newdb();
  while( true ) {
    iVar3 = getopt(in_EDI,in_RSI,"f:a:d:e:b:c");
    cVar2 = (char)iVar3;
    width = CONCAT13(cVar2,(int3)uVar11);
    if (cVar2 == -1) break;
    in_stack_ffffffffffffff78 = (rnndb *)(ulong)((int)cVar2 - 0x61);
    uVar10 = (undefined2)uVar11;
    switch(in_stack_ffffffffffffff78) {
    case (rnndb *)0x0:
      iVar3 = strncasecmp(_optarg,"NV",2);
      if (iVar3 == 0) {
        value = strdup(_optarg);
        uVar11 = width;
      }
      else {
        asprintf((char **)&stack0xffffffffffffffd8,"NV%s",_optarg);
        uVar11 = width;
      }
      break;
    case (rnndb *)0x1:
      uVar11 = CONCAT13(cVar2,CONCAT12(0x62,uVar10));
      ti = strdup(_optarg);
      break;
    case (rnndb *)0x2:
      bVar1 = false;
      uVar11 = width;
      break;
    case (rnndb *)0x3:
      uVar11 = CONCAT13(cVar2,CONCAT12(100,uVar10));
      ti = strdup(_optarg);
      break;
    case (rnndb *)0x4:
      uVar11 = CONCAT13(cVar2,CONCAT12(0x65,uVar10));
      ti = strdup(_optarg);
      break;
    case (rnndb *)0x5:
      pcVar12 = strdup(_optarg);
      uVar11 = width;
      break;
    default:
      usage();
      uVar11 = width;
    }
  }
  rnn_parsefile(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  rnn_prepdb(in_stack_ffffffffffffff70);
  prVar4 = rnndec_newcontext(in_stack_ffffffffffffff70);
  if (bVar1) {
    prVar4->colors = &rnndec_colorsterm;
  }
  if (value != (char *)0x0) {
    rnndec_varadd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                  (char *)in_stack_ffffffffffffff78);
  }
  while (iVar3 = strcmp(in_RSI[_optind],"-v"), iVar3 == 0) {
    rnndec_varadd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                  (char *)in_stack_ffffffffffffff78);
    _optind = _optind + 3;
  }
  if (_optind < in_EDI) {
    uVar5 = strtoull(in_RSI[_optind],(char **)0x0,0x10);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (_optind + 1 < in_EDI) {
      strtoull(in_RSI[_optind + 1],(char **)0x0,0x10);
    }
    cVar2 = (char)(width >> 0x10);
    if (cVar2 == 'e') {
      prVar6 = rnn_findenum(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
      if (prVar6 == (rnnenum *)0x0) {
        fprintf(_stderr,"Not an enum: \'%s\'\n",ti);
        local_4 = 1;
      }
      else {
        bVar1 = false;
        for (iVar3 = 0; iVar3 < prVar6->valsnum; iVar3 = iVar3 + 1) {
          if ((prVar6->vals[iVar3]->valvalid != 0) && (prVar6->vals[iVar3]->value == uVar5)) {
            printf("%s\n",prVar6->vals[iVar3]->name);
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          printf("%#lx\n",uVar5);
        }
        local_4 = 0;
      }
    }
    else if (cVar2 == 'b') {
      prVar7 = rnn_findbitset(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
      if (prVar7 == (rnnbitset *)0x0) {
        fprintf(_stderr,"Not a bitset: \'%s\'\n",ti);
        local_4 = 1;
      }
      else {
        printf("TODO\n");
        local_4 = 0;
      }
    }
    else if (cVar2 == 'd') {
      addr = rnn_finddomain(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
      if (addr == (rnndomain *)0x0) {
        fprintf(_stderr,"Not a domain: \'%s\'\n",ti);
        local_4 = 1;
      }
      else {
        prVar8 = rnndec_decodeaddr((rnndeccontext *)
                                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                   (rnndomain *)in_stack_ffffffffffffff90,(uint64_t)addr,iVar3);
        if ((prVar8 == (rnndecaddrinfo *)0x0) || (prVar8->typeinfo == (rnntypeinfo *)0x0)) {
          if (prVar8 == (rnndecaddrinfo *)0x0) {
            return 1;
          }
          printf("%s\n",prVar8->name);
        }
        else {
          pcVar9 = prVar8->name;
          pcVar12 = rnndec_decodeval((rnndeccontext *)pcVar12,(rnntypeinfo *)ti,(uint64_t)value,
                                     width);
          printf("%s => %s\n",pcVar9,pcVar12);
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"No address specified.\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
	char *file = "nv_mmio.xml";
	char *name = "NV_MMIO";
	char *variant = NULL;
	char c, mode = 'd';
	uint64_t reg, colors=1, val = 0;
	struct rnndeccontext *vc;

	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "f:a:d:e:b:c")) != -1) {
		switch (c) {
			case 'f':
				file = strdup(optarg);
				break;
			case 'e':
				mode = 'e';
				name = strdup(optarg);
				break;
			case 'b':
				mode = 'b';
				name = strdup(optarg);
				break;
			case 'd':
				mode = 'd';
				name = strdup(optarg);
				break;
			case 'a':
				if (!strncasecmp(optarg, "NV", 2))
					variant = strdup(optarg);
				else
					asprintf(&variant, "NV%s", optarg);
				break;
			case 'c':
				colors = 0;
				break;
			default: usage();
		}
	}

	rnn_parsefile (db, file);
	rnn_prepdb (db);
	vc = rnndec_newcontext(db);
	if(colors)
		vc->colors = &rnndec_colorsterm;

	if (variant)
		rnndec_varadd(vc, "chipset", variant);

	/* Parse extra arguments */
	while (!strcmp (argv[optind], "-v")) {
		rnndec_varadd(vc, argv[optind+1], argv[optind+2]);
		optind+=3;
	}

	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}

	reg = strtoull(argv[optind], 0, 16);
	if (optind + 1 < argc)
		val = strtoull(argv[optind + 1], 0, 16);

	if (mode == 'e') {
		struct rnnenum *en = rnn_findenum (db, name);
		if (en) {
			int i;
			int dec = 0;
			for (i = 0; i < en->valsnum; i++)
				if (en->vals[i]->valvalid && en->vals[i]->value == reg) {
					printf ("%s\n", en->vals[i]->name);
					dec = 1;
					break;
				}
			if (!dec)
				printf ("%#"PRIx64"\n", reg);

			return 0;
		} else {
			fprintf(stderr, "Not an enum: '%s'\n", name);
			return 1;
		}
	} else if (mode == 'b') {
		struct rnnbitset *bs = rnn_findbitset (db, name);

		if (bs) {
			printf("TODO\n");
			return 0;
		} else {
			fprintf(stderr, "Not a bitset: '%s'\n", name);
			return 1;
		}

	} else if (mode == 'd') {
		struct rnndomain *dom = rnn_finddomain (db, name);

		if (dom) {
			struct rnndecaddrinfo *info = rnndec_decodeaddr(vc, dom, reg, 0);
			if (info && info->typeinfo)
				printf ("%s => %s\n", info->name, rnndec_decodeval(vc, info->typeinfo, val, info->width));
			else if (info)
				printf ("%s\n", info->name);
			else
				return 1;
			return 0;
		} else {
			fprintf(stderr, "Not a domain: '%s'\n", name);
			return 1;
		}
	} else {
		return 1;
	}
}